

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

optional<std::pair<CPubKey,_int>_> * __thiscall
miniscript::internal::ParseKeyEnd<CPubKey,(anonymous_namespace)::KeyConverter>
          (optional<std::pair<CPubKey,_int>_> *__return_storage_ptr__,internal *this,
          Span<const_char> in,KeyConverter *ctx)

{
  bool bVar1;
  uint uVar2;
  char *last;
  long lVar3;
  undefined4 *puVar4;
  optional<std::pair<CPubKey,_int>_> *poVar5;
  long in_FS_OFFSET;
  byte bVar6;
  Span<const_char> sp;
  optional<CPubKey> key;
  undefined4 local_b0 [17];
  optional<CPubKey> local_6a;
  optional<std::pair<CPubKey,_int>_> *local_28;
  
  last = (char *)in.m_size;
  bVar6 = 0;
  local_28 = *(optional<std::pair<CPubKey,_int>_> **)(in_FS_OFFSET + 0x28);
  sp.m_size = 0x29;
  sp.m_data = in.m_data;
  uVar2 = FindNextChar(this,sp,(char)in.m_size);
  if ((int)uVar2 < 1) {
    (__return_storage_ptr__->super__Optional_base<std::pair<CPubKey,_int>,_true,_true>)._M_payload.
    super__Optional_payload_base<std::pair<CPubKey,_int>_>._M_engaged = false;
  }
  else {
    (anonymous_namespace)::KeyConverter::FromString<char_const*>
              (&local_6a,this,(char *)(this + uVar2),last);
    if (local_6a.super__Optional_base<CPubKey,_true,_true>._M_payload.
        super__Optional_payload_base<CPubKey>._M_engaged == true) {
      memcpy(local_b0,&local_6a,0x41);
      puVar4 = local_b0;
      poVar5 = __return_storage_ptr__;
      for (lVar3 = 0x11; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined4 *)
         &(poVar5->super__Optional_base<std::pair<CPubKey,_int>,_true,_true>)._M_payload.
          super__Optional_payload_base<std::pair<CPubKey,_int>_>._M_payload = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        poVar5 = (optional<std::pair<CPubKey,_int>_> *)((long)poVar5 + (ulong)bVar6 * -8 + 4);
      }
      (__return_storage_ptr__->super__Optional_base<std::pair<CPubKey,_int>,_true,_true>)._M_payload
      .super__Optional_payload_base<std::pair<CPubKey,_int>_>._M_payload._M_value.second = uVar2;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    (__return_storage_ptr__->super__Optional_base<std::pair<CPubKey,_int>,_true,_true>)._M_payload.
    super__Optional_payload_base<std::pair<CPubKey,_int>_>._M_engaged = bVar1;
  }
  if (*(optional<std::pair<CPubKey,_int>_> **)(in_FS_OFFSET + 0x28) == local_28) {
    return *(optional<std::pair<CPubKey,_int>_> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<Key, int>> ParseKeyEnd(Span<const char> in, const Ctx& ctx)
{
    int key_size = FindNextChar(in, ')');
    if (key_size < 1) return {};
    auto key = ctx.FromString(in.begin(), in.begin() + key_size);
    if (!key) return {};
    return {{std::move(*key), key_size}};
}